

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_listener::handle_accept
          (asio_rpc_listener *this,ptr<asio_rpc_listener> *self,ptr<rpc_session> *session,
          error_code *err)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  undefined8 uVar5;
  error_code *in_RCX;
  long in_RDI;
  lock_guard<std::mutex> guard;
  asio_rpc_listener *in_stack_00000048;
  rpc_session *in_stack_00000060;
  mutex_type *in_stack_ffffffffffffff28;
  lock_guard<std::mutex> *in_stack_ffffffffffffff30;
  error_code *in_stack_ffffffffffffff48;
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  error_code *local_20;
  
  local_20 = in_RCX;
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x118));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x28c0c1);
      iVar2 = (*peVar4->_vptr_logger[7])();
      if (1 < iVar2) {
        in_stack_ffffffffffffff30 =
             (lock_guard<std::mutex> *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x28c0e4);
        uVar3 = std::error_code::value(local_20);
        std::error_code::message_abi_cxx11_(in_stack_ffffffffffffff48);
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_70,"failed to accept a rpc connection due to error %d, %s",
                   (ulong)uVar3,uVar5);
        (**(_func_int **)
           ((long)&in_stack_ffffffffffffff30->_M_device[1].super___mutex_base._M_mutex + 0x18))
                  (in_stack_ffffffffffffff30,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_accept",0x349,local_70);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
      }
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x118));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x28bfd9);
      iVar2 = (*peVar4->_vptr_logger[7])();
      if (3 < iVar2) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x28bffc);
        msg_if_given_abi_cxx11_((char *)local_40,"receive a incoming rpc connection");
        (*peVar4->_vptr_logger[8])
                  (peVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_accept",0x344,local_40);
        std::__cxx11::string::~string(local_40);
      }
    }
    std::__shared_ptr_access<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x28c089);
    rpc_session::prepare_handshake(in_stack_00000060);
  }
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
    start(in_stack_00000048,(lock_guard<std::mutex> *)guard._M_device);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x28c218);
  return;
}

Assistant:

void handle_accept(ptr<asio_rpc_listener> self,
                       ptr<rpc_session> session,
                       const ERROR_CODE& err)
    {
        if (!err) {
            p_in("receive a incoming rpc connection");
            session->prepare_handshake();

        } else {
            p_er( "failed to accept a rpc connection due to error %d, %s",
                  err.value(), err.message().c_str() );
        }

        std::lock_guard<std::mutex> guard(listener_lock_);
        if (!stopped_) {
            // Re-listen only when not stopped,
            // otherwise crash happens as this class or `acceptor_`
            // may be destroyed in the meantime.
            this->start(guard);
        }
    }